

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O3

int __thiscall CBoundary::AddWire(CBoundary *this,CWire *pWire)

{
  pointer *pppCVar1;
  short sVar2;
  undefined4 uVar3;
  iterator __position;
  int iVar4;
  CLayer *pCVar5;
  short sVar6;
  CWire *local_20;
  
  local_20 = pWire;
  if ((pWire->super_CObject).m_pParent == (CObject *)0x0) {
    __assert_fail("pWire->GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x89,"int CBoundary::AddWire(CWire *)");
  }
  if (((pWire->super_CObject).m_iState & 1) == 0) {
    __assert_fail("pWire->IsRouted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x8a,"int CBoundary::AddWire(CWire *)");
  }
  iVar4 = CWire::IsFlat(pWire);
  if (iVar4 == 0) {
    __assert_fail("pWire->IsFlat()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x8b,"int CBoundary::AddWire(CWire *)");
  }
  pCVar5 = CWire::GetLayer(pWire);
  iVar4 = CLayer::Z(pCVar5);
  if (iVar4 == (this->super_CPoint).m_cZ) {
    sVar2 = this->m_iCongestion;
    iVar4 = IsFound(this,pWire);
    if (iVar4 != 0) {
      __assert_fail("!IsFound(pWire)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                    ,0x92,"int CBoundary::AddWire(CWire *)");
    }
    __position._M_current =
         (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                ((vector<CWire*,std::allocator<CWire*>> *)&this->m_Wire,__position,&local_20);
      pWire = local_20;
    }
    else {
      *__position._M_current = pWire;
      pppCVar1 = &(this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    iVar4 = IsFound(this,pWire);
    if (iVar4 != 0) {
      uVar3 = *(undefined4 *)&(this->super_CPoint).field_0x26;
      sVar6 = (short)uVar3 + 2;
      *(uint *)&(this->super_CPoint).field_0x26 = CONCAT22((short)((uint)uVar3 >> 0x10) + -2,sVar6);
      pCVar5 = (CLayer *)(this->super_CPoint).super_CObject.m_pParent;
      sVar6 = (short)((sVar6 * 100) / pCVar5->m_iMaxCapacity);
      this->m_iCongestion = sVar6;
      CLayer::TrackCongestion(pCVar5,this,(int)sVar2,(int)sVar6);
      return 1;
    }
    __assert_fail("IsFound(pWire)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x96,"int CBoundary::AddWire(CWire *)");
  }
  __assert_fail("pWire->GetLayer()->Z()==Z()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                ,0x8c,"int CBoundary::AddWire(CWire *)");
}

Assistant:

int CBoundary::AddWire(CWire *pWire)
{
	//!this is called from CNet::Addwire when a new *ROUTED* wire is added
	assert(pWire->GetParent());
	assert(pWire->IsRouted());
	assert(pWire->IsFlat());
	assert(pWire->GetLayer()->Z()==Z());

	//save old congestion number for TrackCongestion
	int		iOldC	=	GetCongestion();

	// each boundary has only one single pass from every net [6/30/2006 thyeros]
	assert(!IsFound(pWire));

	m_Wire.push_back(pWire);

	assert(IsFound(pWire));

    //! Notice: Did the same thing with @ref AdjustCapacity()
	// update occupied capacity [2/9/2007 thyeros]
	m_iNumOCap		+=	WIRE_WIDTH_SPACE;//(pWire->GetParent()->GetWidth()+GetParent()->GetDesignRule(GET_DR_MIN_WIR_SPACING));
	m_iNumACap		-=	WIRE_WIDTH_SPACE;//GetParent()->GetCapacity(GET_MODE_MAX)-m_iNumOCap;
	m_iCongestion	=	100*m_iNumOCap/GetParent()->m_iMaxCapacity;

	//update the congestion statictics in the parent layer
	GetParent()->TrackCongestion(this,iOldC,m_iCongestion);

	return	TRUE;
}